

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRenderer::DebugXmlRules
          (GdlRenderer *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur)

{
  GdlRuleTable *pGVar1;
  ostream *poVar2;
  allocator local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator<<((ostream *)strmOut,"  <rules>\n");
  std::__cxx11::string::string((string *)&local_d0,"linebreak",&local_131);
  pGVar1 = FindRuleTable(this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string((string *)&local_50,(string *)staPathToCur);
    GdlRuleTable::DebugXmlRules(pGVar1,pcman,strmOut,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_f0,"substitution",&local_131);
  pGVar1 = FindRuleTable(this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string((string *)&local_70,(string *)staPathToCur);
    GdlRuleTable::DebugXmlRules(pGVar1,pcman,strmOut,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (this->m_nBidi == 2) {
    poVar2 = std::operator<<((ostream *)strmOut,"    <pass table=\"bidi\" index=\"");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ipassBidi + 1);
    std::operator<<(poVar2,"\" />\n");
  }
  std::__cxx11::string::string((string *)&local_110,"justification",&local_131);
  pGVar1 = FindRuleTable(this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string((string *)&local_90,(string *)staPathToCur);
    GdlRuleTable::DebugXmlRules(pGVar1,pcman,strmOut,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::string((string *)&local_130,"positioning",&local_131);
  pGVar1 = FindRuleTable(this,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    std::__cxx11::string::string((string *)&local_b0,(string *)staPathToCur);
    GdlRuleTable::DebugXmlRules(pGVar1,pcman,strmOut,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::operator<<((ostream *)strmOut,"  </rules>\n\n");
  return;
}

Assistant:

void GdlRenderer::DebugXmlRules(GrcManager * pcman, std::ofstream & strmOut,
	std::string staPathToCur)
{
	strmOut << "  <rules>\n";

	GdlRuleTable * prultbl;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if (RawBidi() == kFullPass)
		strmOut << "    <pass table=\"bidi\" index=\"" << m_ipassBidi + 1 << "\" />\n";

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	strmOut << "  </rules>\n\n";
}